

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_common_int.h
# Opt level: O2

void av1_init_macroblockd(AV1_COMMON *cm,MACROBLOCKD *xd)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  qm_val_t *(*__src) [19];
  long lVar5;
  long lVar6;
  
  lVar5 = 0xa30;
  if (cm->seq_params->monochrome == '\0') {
    lVar5 = 0x1e90;
  }
  for (lVar6 = 0; lVar5 != lVar6; lVar6 = lVar6 + 0xa30) {
    if (*(char *)((long)xd->plane[0].pre + lVar6 + -0x30) == '\0') {
      uVar1 = *(undefined8 *)(cm->quant_params).y_dequant_QTX;
      uVar2 = *(undefined8 *)((cm->quant_params).y_dequant_QTX + 2);
      uVar3 = *(undefined8 *)((cm->quant_params).y_dequant_QTX + 6);
      puVar4 = (undefined8 *)((long)xd->plane[0].seg_dequant_QTX[4] + lVar6);
      *puVar4 = *(undefined8 *)((cm->quant_params).y_dequant_QTX + 4);
      puVar4[1] = uVar3;
      puVar4 = (undefined8 *)((long)xd->plane[0].seg_dequant_QTX[0] + lVar6);
      *puVar4 = uVar1;
      puVar4[1] = uVar2;
      __src = (cm->quant_params).y_iqmatrix;
    }
    else {
      puVar4 = (undefined8 *)((long)xd->plane[0].seg_dequant_QTX[0] + lVar6);
      if (lVar6 == 0xa30) {
        uVar1 = *(undefined8 *)(cm->quant_params).u_dequant_QTX;
        uVar2 = *(undefined8 *)((cm->quant_params).u_dequant_QTX + 2);
        uVar3 = *(undefined8 *)((cm->quant_params).u_dequant_QTX + 6);
        *(undefined8 *)(xd->plane[0].seg_dequant_QTX + 0x290) =
             *(undefined8 *)((cm->quant_params).u_dequant_QTX + 4);
        *(undefined8 *)(xd->plane[0].seg_dequant_QTX + 0x292) = uVar3;
        *puVar4 = uVar1;
        *(undefined8 *)(xd->plane[0].seg_dequant_QTX + 0x28e) = uVar2;
        __src = (cm->quant_params).u_iqmatrix;
      }
      else {
        uVar1 = *(undefined8 *)(cm->quant_params).v_dequant_QTX;
        uVar2 = *(undefined8 *)((cm->quant_params).v_dequant_QTX + 2);
        uVar3 = *(undefined8 *)((cm->quant_params).v_dequant_QTX + 6);
        *(undefined8 *)((long)xd->plane[0].seg_dequant_QTX[4] + lVar6) =
             *(undefined8 *)((cm->quant_params).v_dequant_QTX + 4);
        *(undefined8 *)((long)xd->plane[0].seg_dequant_QTX[6] + lVar6) = uVar3;
        *puVar4 = uVar1;
        *(undefined8 *)((long)xd->plane[0].seg_dequant_QTX[2] + lVar6) = uVar2;
        __src = (cm->quant_params).v_iqmatrix;
      }
    }
    memcpy((void *)((long)xd->plane[0].seg_iqmatrix[0] + lVar6),__src,0x4c0);
  }
  xd->mi_stride = (cm->mi_params).mi_stride;
  xd->error_info = cm->error;
  cfl_init(&xd->cfl,cm->seq_params);
  return;
}

Assistant:

static inline void av1_init_macroblockd(AV1_COMMON *cm, MACROBLOCKD *xd) {
  const int num_planes = av1_num_planes(cm);
  const CommonQuantParams *const quant_params = &cm->quant_params;

  for (int i = 0; i < num_planes; ++i) {
    if (xd->plane[i].plane_type == PLANE_TYPE_Y) {
      memcpy(xd->plane[i].seg_dequant_QTX, quant_params->y_dequant_QTX,
             sizeof(quant_params->y_dequant_QTX));
      memcpy(xd->plane[i].seg_iqmatrix, quant_params->y_iqmatrix,
             sizeof(quant_params->y_iqmatrix));

    } else {
      if (i == AOM_PLANE_U) {
        memcpy(xd->plane[i].seg_dequant_QTX, quant_params->u_dequant_QTX,
               sizeof(quant_params->u_dequant_QTX));
        memcpy(xd->plane[i].seg_iqmatrix, quant_params->u_iqmatrix,
               sizeof(quant_params->u_iqmatrix));
      } else {
        memcpy(xd->plane[i].seg_dequant_QTX, quant_params->v_dequant_QTX,
               sizeof(quant_params->v_dequant_QTX));
        memcpy(xd->plane[i].seg_iqmatrix, quant_params->v_iqmatrix,
               sizeof(quant_params->v_iqmatrix));
      }
    }
  }
  xd->mi_stride = cm->mi_params.mi_stride;
  xd->error_info = cm->error;
#if !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
  cfl_init(&xd->cfl, cm->seq_params);
#endif
}